

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O2

void pzshape::TPZShapePrism::TransformDerivativeFromFaceToPrisma
               (int face,int num,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  ulong col;
  
  lVar7 = (long)face * 0x30;
  col = 0;
  uVar8 = (ulong)(uint)num;
  if (num < 1) {
    uVar8 = col;
  }
  for (; uVar8 != col; col = col + 1) {
    dVar1 = *(double *)(gFaceTrans3dPrisma2d + lVar7 + 0x10);
    pdVar6 = TPZFMatrix<double>::operator()(dphi,0,col);
    dVar2 = *(double *)(gFaceTrans3dPrisma2d + lVar7 + 0x28);
    dVar3 = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()(dphi,1,col);
    dVar4 = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()(dphi,2,col);
    *pdVar6 = dVar2 * dVar4 + dVar1 * dVar3;
    pdVar6 = TPZFMatrix<double>::operator()(dphi,1,col);
    dVar1 = *pdVar6;
    dVar2 = *(double *)(gFaceTrans3dPrisma2d + lVar7 + 8);
    pdVar6 = TPZFMatrix<double>::operator()(dphi,0,col);
    dVar3 = *(double *)(gFaceTrans3dPrisma2d + lVar7 + 0x20);
    dVar4 = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()(dphi,1,col);
    dVar5 = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()(dphi,1,col);
    *pdVar6 = dVar3 * dVar5 + dVar2 * dVar4;
    dVar2 = *(double *)(gFaceTrans3dPrisma2d + lVar7);
    pdVar6 = TPZFMatrix<double>::operator()(dphi,0,col);
    dVar3 = *(double *)(gFaceTrans3dPrisma2d + lVar7 + 0x18);
    dVar4 = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()(dphi,0,col);
    *pdVar6 = dVar2 * dVar4 + dVar1 * dVar3;
  }
  return;
}

Assistant:

void TPZShapePrism::TransformDerivativeFromFaceToPrisma(int face,int num,TPZFMatrix<REAL> &dphi) {
		for (int j = 0;j<num;j++) {
			dphi(2,j) = gFaceTrans3dPrisma2d[face][0][2]*dphi(0,j)+gFaceTrans3dPrisma2d[face][1][2]*dphi(1,j);
			REAL dphi1j = dphi(1,j);
			dphi(1,j) = gFaceTrans3dPrisma2d[face][0][1]*dphi(0,j)+gFaceTrans3dPrisma2d[face][1][1]*dphi(1,j);
			dphi(0,j) = gFaceTrans3dPrisma2d[face][0][0]*dphi(0,j)+gFaceTrans3dPrisma2d[face][1][0]*dphi1j;//dphi(1,j);
		}
	}